

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-iso8601.c
# Opt level: O0

void test_date_io(char *str_in,char *str_out,int64_t millis)

{
  int iVar1;
  long *plVar2;
  bson_string_t *bson_str;
  int64_t millis_local;
  char *str_out_local;
  char *str_in_local;
  
  test_date(str_in,millis);
  plVar2 = (long *)bson_string_new(0);
  _bson_iso8601_date_format(millis,plVar2);
  if ((char *)*plVar2 != str_out) {
    iVar1 = strcmp((char *)*plVar2,str_out);
    if (iVar1 != 0) {
      fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" != \"%s\"\n",*plVar2,str_out);
      abort();
    }
  }
  bson_string_free(plVar2,1);
  return;
}

Assistant:

static void
test_date_io (const char *str_in, const char *str_out, int64_t millis)
{
   bson_string_t *bson_str;

   test_date (str_in, millis);

   bson_str = bson_string_new (NULL);
   _bson_iso8601_date_format (millis, bson_str);
   ASSERT_CMPSTR (bson_str->str, str_out);
   bson_string_free (bson_str, true);
}